

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConfusableMatcher.cpp
# Opt level: O3

bool __thiscall ConfusableMatcher::MatchWordBoundaryToLeft(ConfusableMatcher *this,CMStringView In)

{
  bool bVar1;
  int iVar2;
  
  if (In._M_len < 5) {
    if (In._M_len == 0) {
      bVar1 = false;
    }
    else {
      iVar2 = MatchWordBoundary(this,(uchar *)In._M_str,(int)In._M_len);
      bVar1 = 0 < iVar2;
    }
    return bVar1;
  }
  __assert_fail("In.size() < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/TETYYS[P]ConfusableMatcher/ConfusableMatcher.cpp"
                ,0x13f,"bool ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView)");
}

Assistant:

bool ConfusableMatcher::MatchWordBoundaryToLeft(CMStringView In)
{
	/*
	 * When searching from right to left, it doesn't need to worry about anything special
	 * as first char will be always in the same spot
	 */
	assert(In.size() < 5);
	
	if (In.size() == 0)
		return false;

	/*
	 * Try to decode any kind of char, starting with smallest chars first.
	 * Here we don't care if we decode character that spans less bytes than we have in In.size()
	 * as start will always touch the match
	 */
	if (MatchWordBoundary((const unsigned char*)In.data(), In.size()) >= 1)
		return true;

	return false;
}